

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetToken(uchar *z,int *tokenType)

{
  uchar *puVar1;
  bool bVar2;
  long lVar3;
  uchar uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  byte *pbVar13;
  
  bVar12 = *z;
  lVar8 = 1;
  switch("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
         [bVar12]) {
  case '\0':
    if (z[1] == '\'') {
      *tokenType = 0x92;
      uVar11 = 1;
      do {
        lVar8 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while ((""[z[lVar8]] & 8) != 0);
      if ((uVar11 & 1) != 0 || z[lVar8] != 0x27) {
        *tokenType = 0xaf;
        for (; (z[uVar11] != '\0' && (z[uVar11] != '\'')); uVar11 = uVar11 + 1) {
        }
      }
      uVar11 = (ulong)(((int)uVar11 + 1) - (uint)(z[(int)uVar11] == '\0'));
      goto LAB_00156627;
    }
  case '\x02':
switchD_00156113_caseD_2:
    uVar11 = (ulong)((int)lVar8 - 1);
    pbVar13 = z + lVar8;
    do {
      bVar12 = *pbVar13;
      uVar11 = (ulong)((int)uVar11 + 1);
      pbVar13 = pbVar13 + 1;
    } while ((""[bVar12] & 0x46) != 0);
LAB_00156399:
    *tokenType = 0x3b;
    goto LAB_00156627;
  case '\x01':
    uVar11 = 0;
    lVar8 = 0x100000000;
    do {
      lVar3 = uVar11 + 1;
      lVar8 = lVar8 + 0x100000000;
      uVar11 = uVar11 + 1;
    } while ("\x1c\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\a\x1b\a\a\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\x1b\a\x0f\b\x05\x04\x16\x18\b\x11\x12\x15\x14\x17\v\x1a\x10\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x05\x13\f\x0e\r\x06\x05\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
             [z[lVar3]] < 2);
    if ((""[z[lVar3]] & 0x46) == 0) {
      *tokenType = 0x3b;
      keywordCode((char *)z,(int)uVar11,tokenType);
      goto LAB_00156627;
    }
    lVar8 = lVar8 >> 0x20;
    goto switchD_00156113_caseD_2;
  case '\x03':
    goto switchD_00156113_caseD_3;
  case '\x04':
  case '\x05':
    *tokenType = 0x94;
    bVar12 = z[1];
    uVar11 = 1;
    if (bVar12 != 0) {
      iVar7 = 0;
      do {
        iVar10 = (int)uVar11;
        if ((""[bVar12] & 0x46) == 0) {
          if (0 < iVar7 && bVar12 == 0x28) {
            pbVar13 = z + iVar10;
            uVar11 = (ulong)(iVar10 + 1);
            goto LAB_00156637;
          }
          if ((bVar12 != 0x3a) || (z[(long)iVar10 + 1] != ':')) break;
          iVar10 = iVar10 + 1;
        }
        else {
          iVar7 = iVar7 + 1;
        }
        bVar12 = z[(long)iVar10 + 1];
        uVar11 = (long)iVar10 + 1;
      } while (bVar12 != 0);
      if (iVar7 != 0) goto LAB_00156627;
    }
    goto LAB_0015618a;
  case '\x06':
    *tokenType = 0x94;
    uVar11 = 0;
    do {
      lVar8 = uVar11 + 1;
      uVar11 = uVar11 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar8] - 0x3a);
    goto LAB_00156627;
  case '\a':
    uVar11 = 0;
    do {
      lVar8 = uVar11 + 1;
      uVar11 = uVar11 + 1;
    } while ((""[z[lVar8]] & 1) != 0);
    goto LAB_001562eb;
  case '\b':
    uVar11 = 1;
    bVar6 = z[1];
    while (iVar7 = (int)uVar11, bVar6 != 0) {
      if (bVar6 == bVar12) {
        lVar8 = (long)iVar7;
        uVar11 = lVar8 + 1;
        iVar7 = (int)uVar11;
        if (z[lVar8 + 1] != bVar12) {
          if (bVar12 != 0x27) goto LAB_00156399;
          *tokenType = 0x6e;
          goto LAB_00156627;
        }
      }
      uVar11 = (long)iVar7 + 1;
      bVar6 = z[(long)iVar7 + 1];
    }
LAB_0015618a:
    *tokenType = 0xaf;
    goto LAB_00156627;
  case '\t':
    if (bVar12 == 0x5d) {
      iVar7 = 0x3b;
      uVar11 = 1;
    }
    else {
      uVar11 = 1;
      do {
        puVar1 = z + uVar11;
        if (*puVar1 == '\0') {
          iVar7 = 0xaf;
          goto LAB_001565d5;
        }
        uVar11 = uVar11 + 1;
      } while (*puVar1 != ']');
      iVar7 = 0x3b;
    }
LAB_001565d5:
    *tokenType = iVar7;
    goto LAB_00156627;
  case '\n':
    if (z[1] != '|') {
      *tokenType = 0x61;
      break;
    }
    *tokenType = 0x69;
    goto LAB_00156615;
  case '\v':
    if (z[1] != '-') {
      *tokenType = 0x65;
      break;
    }
    for (uVar11 = 2; (z[uVar11] != '\0' && (z[uVar11] != '\n')); uVar11 = uVar11 + 1) {
    }
    goto LAB_001562eb;
  case '\f':
    uVar4 = z[1];
    if (uVar4 == '<') {
      *tokenType = 0x62;
    }
    else {
      if (uVar4 == '>') goto LAB_00156571;
      if (uVar4 != '=') {
        *tokenType = 0x38;
        break;
      }
      *tokenType = 0x37;
    }
    goto LAB_00156615;
  case '\r':
    if (z[1] == '>') {
      *tokenType = 99;
    }
    else {
      if (z[1] != '=') {
        *tokenType = 0x36;
        break;
      }
      *tokenType = 0x39;
    }
    goto LAB_00156615;
  case '\x0e':
    *tokenType = 0x35;
    uVar11 = (ulong)((z[1] == '=') + 1);
    goto LAB_00156627;
  case '\x0f':
    if (z[1] != '=') goto switchD_00156113_caseD_1b;
LAB_00156571:
    *tokenType = 0x34;
LAB_00156615:
    uVar11 = 2;
    goto LAB_00156627;
  case '\x10':
    if ((z[1] != '*') || (z[2] == '\0')) {
      *tokenType = 0x67;
      break;
    }
    uVar11 = 4;
    if (z[3] != '/' || z[2] != '*') {
      lVar8 = 0;
      uVar4 = z[3];
      do {
        if (uVar4 == '\0') {
          uVar11 = (ulong)((int)lVar8 + 3);
          goto LAB_001562eb;
        }
        lVar3 = lVar8 + 4;
        lVar8 = lVar8 + 1;
        bVar2 = uVar4 != '*';
        uVar4 = z[lVar3];
      } while (z[lVar3] != '/' || bVar2);
      uVar11 = (ulong)((int)lVar8 + 4);
    }
LAB_001562eb:
    *tokenType = 0xae;
    goto LAB_00156627;
  case '\x11':
    *tokenType = 0x16;
    break;
  case '\x12':
    *tokenType = 0x17;
    break;
  case '\x13':
    *tokenType = 1;
    break;
  case '\x14':
    *tokenType = 100;
    break;
  case '\x15':
    *tokenType = 0x66;
    break;
  case '\x16':
    *tokenType = 0x68;
    break;
  case '\x17':
    *tokenType = 0x1a;
    break;
  case '\x18':
    *tokenType = 0x60;
    break;
  case '\x19':
    *tokenType = 0x6b;
    break;
  case '\x1a':
    if ((ulong)z[1] - 0x3a < 0xfffffffffffffff6) {
      *tokenType = 0x86;
      break;
    }
    goto switchD_00156113_caseD_3;
  default:
switchD_00156113_caseD_1b:
    *tokenType = 0xaf;
    break;
  case '\x1c':
    *tokenType = 0xaf;
    uVar11 = 0;
    goto LAB_00156627;
  }
  uVar11 = 1;
LAB_00156627:
  return (int)uVar11;
  while ((uVar11 = (ulong)((int)uVar5 + 1), uVar9 != 0x29 && ((""[uVar9] & 1) == 0))) {
LAB_00156637:
    uVar5 = uVar11;
    pbVar13 = pbVar13 + 1;
    uVar9 = (ulong)*pbVar13;
    if (uVar9 == 0) goto LAB_0015665f;
  }
  if (*pbVar13 != 0x29) {
LAB_0015665f:
    *tokenType = 0xaf;
    uVar11 = uVar5;
  }
  goto LAB_00156627;
switchD_00156113_caseD_3:
  *tokenType = 0x93;
  if (((*z == '0') && ((z[1] | 0x20) == 0x78)) && ((""[z[2]] & 8) != 0)) {
    lVar8 = 3;
    do {
      pbVar13 = z + lVar8;
      lVar8 = lVar8 + 1;
    } while ((""[*pbVar13] & 8) != 0);
    uVar11 = (ulong)((int)lVar8 - 1);
  }
  else {
    uVar11 = 0xffffffffffffffff;
    do {
      lVar8 = uVar11 + 1;
      uVar11 = uVar11 + 1;
    } while (0xfffffffffffffff5 < (ulong)z[lVar8] - 0x3a);
    if (z[lVar8] == 0x2e) {
      do {
        lVar8 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while (0xfffffffffffffff5 < (ulong)z[lVar8] - 0x3a);
      *tokenType = 0x91;
    }
    uVar5 = (ulong)(int)uVar11;
    uVar9 = (ulong)z[uVar5];
    if (((z[uVar5] | 0x20) == 0x65) &&
       ((bVar12 = z[uVar5 + 1], 0xfffffffffffffff5 < (ulong)bVar12 - 0x3a ||
        (((bVar12 == 0x2d || (bVar12 == 0x2b)) && (0xfffffffffffffff5 < (ulong)z[uVar5 + 2] - 0x3a))
        )))) {
      lVar8 = uVar11 << 0x20;
      uVar11 = (lVar8 + 0x200000000 >> 0x20) - 1;
      lVar8 = lVar8 + 0x100000000;
      do {
        lVar3 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x100000000;
      } while (0xfffffffffffffff5 < (ulong)z[lVar3] - 0x3a);
      *tokenType = 0x91;
      uVar5 = lVar8 >> 0x20;
      uVar9 = (ulong)z[uVar5];
    }
    if ((""[uVar9] & 0x46) != 0) {
      pbVar13 = z + uVar5;
      uVar11 = uVar5 & 0xffffffff;
      do {
        pbVar13 = pbVar13 + 1;
        *tokenType = 0xaf;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while ((""[*pbVar13] & 0x46) != 0);
    }
  }
  goto LAB_00156627;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetToken(const unsigned char *z, int *tokenType){
  int i, c;
  switch( aiClass[*z] ){  /* Switch on the character-class of the first byte
                          ** of the token. See the comment on the CC_ defines
                          ** above. */
    case CC_SPACE: {
      testcase( z[0]==' ' );
      testcase( z[0]=='\t' );
      testcase( z[0]=='\n' );
      testcase( z[0]=='\f' );
      testcase( z[0]=='\r' );
      for(i=1; sqlite3Isspace(z[i]); i++){}
      *tokenType = TK_SPACE;
      return i;
    }
    case CC_MINUS: {
      if( z[1]=='-' ){
        for(i=2; (c=z[i])!=0 && c!='\n'; i++){}
        *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
        return i;
      }
      *tokenType = TK_MINUS;
      return 1;
    }
    case CC_LP: {
      *tokenType = TK_LP;
      return 1;
    }
    case CC_RP: {
      *tokenType = TK_RP;
      return 1;
    }
    case CC_SEMI: {
      *tokenType = TK_SEMI;
      return 1;
    }
    case CC_PLUS: {
      *tokenType = TK_PLUS;
      return 1;
    }
    case CC_STAR: {
      *tokenType = TK_STAR;
      return 1;
    }
    case CC_SLASH: {
      if( z[1]!='*' || z[2]==0 ){
        *tokenType = TK_SLASH;
        return 1;
      }
      for(i=3, c=z[2]; (c!='*' || z[i]!='/') && (c=z[i])!=0; i++){}
      if( c ) i++;
      *tokenType = TK_SPACE;   /* IMP: R-22934-25134 */
      return i;
    }
    case CC_PERCENT: {
      *tokenType = TK_REM;
      return 1;
    }
    case CC_EQ: {
      *tokenType = TK_EQ;
      return 1 + (z[1]=='=');
    }
    case CC_LT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_LE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_NE;
        return 2;
      }else if( c=='<' ){
        *tokenType = TK_LSHIFT;
        return 2;
      }else{
        *tokenType = TK_LT;
        return 1;
      }
    }
    case CC_GT: {
      if( (c=z[1])=='=' ){
        *tokenType = TK_GE;
        return 2;
      }else if( c=='>' ){
        *tokenType = TK_RSHIFT;
        return 2;
      }else{
        *tokenType = TK_GT;
        return 1;
      }
    }
    case CC_BANG: {
      if( z[1]!='=' ){
        *tokenType = TK_ILLEGAL;
        return 1;
      }else{
        *tokenType = TK_NE;
        return 2;
      }
    }
    case CC_PIPE: {
      if( z[1]!='|' ){
        *tokenType = TK_BITOR;
        return 1;
      }else{
        *tokenType = TK_CONCAT;
        return 2;
      }
    }
    case CC_COMMA: {
      *tokenType = TK_COMMA;
      return 1;
    }
    case CC_AND: {
      *tokenType = TK_BITAND;
      return 1;
    }
    case CC_TILDA: {
      *tokenType = TK_BITNOT;
      return 1;
    }
    case CC_QUOTE: {
      int delim = z[0];
      testcase( delim=='`' );
      testcase( delim=='\'' );
      testcase( delim=='"' );
      for(i=1; (c=z[i])!=0; i++){
        if( c==delim ){
          if( z[i+1]==delim ){
            i++;
          }else{
            break;
          }
        }
      }
      if( c=='\'' ){
        *tokenType = TK_STRING;
        return i+1;
      }else if( c!=0 ){
        *tokenType = TK_ID;
        return i+1;
      }else{
        *tokenType = TK_ILLEGAL;
        return i;
      }
    }
    case CC_DOT: {
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( !sqlite3Isdigit(z[1]) )
#endif
      {
        *tokenType = TK_DOT;
        return 1;
      }
      /* If the next character is a digit, this is a floating point
      ** number that begins with ".".  Fall thru into the next case */
    }
    case CC_DIGIT: {
      testcase( z[0]=='0' );  testcase( z[0]=='1' );  testcase( z[0]=='2' );
      testcase( z[0]=='3' );  testcase( z[0]=='4' );  testcase( z[0]=='5' );
      testcase( z[0]=='6' );  testcase( z[0]=='7' );  testcase( z[0]=='8' );
      testcase( z[0]=='9' );
      *tokenType = TK_INTEGER;
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( z[0]=='0' && (z[1]=='x' || z[1]=='X') && sqlite3Isxdigit(z[2]) ){
        for(i=3; sqlite3Isxdigit(z[i]); i++){}
        return i;
      }
#endif
      for(i=0; sqlite3Isdigit(z[i]); i++){}
#ifndef SQLITE_OMIT_FLOATING_POINT
      if( z[i]=='.' ){
        i++;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
      if( (z[i]=='e' || z[i]=='E') &&
           ( sqlite3Isdigit(z[i+1]) 
            || ((z[i+1]=='+' || z[i+1]=='-') && sqlite3Isdigit(z[i+2]))
           )
      ){
        i += 2;
        while( sqlite3Isdigit(z[i]) ){ i++; }
        *tokenType = TK_FLOAT;
      }
#endif
      while( IdChar(z[i]) ){
        *tokenType = TK_ILLEGAL;
        i++;
      }
      return i;
    }
    case CC_QUOTE2: {
      for(i=1, c=z[0]; c!=']' && (c=z[i])!=0; i++){}
      *tokenType = c==']' ? TK_ID : TK_ILLEGAL;
      return i;
    }
    case CC_VARNUM: {
      *tokenType = TK_VARIABLE;
      for(i=1; sqlite3Isdigit(z[i]); i++){}
      return i;
    }
    case CC_DOLLAR:
    case CC_VARALPHA: {
      int n = 0;
      testcase( z[0]=='$' );  testcase( z[0]=='@' );
      testcase( z[0]==':' );  testcase( z[0]=='#' );
      *tokenType = TK_VARIABLE;
      for(i=1; (c=z[i])!=0; i++){
        if( IdChar(c) ){
          n++;
#ifndef SQLITE_OMIT_TCL_VARIABLE
        }else if( c=='(' && n>0 ){
          do{
            i++;
          }while( (c=z[i])!=0 && !sqlite3Isspace(c) && c!=')' );
          if( c==')' ){
            i++;
          }else{
            *tokenType = TK_ILLEGAL;
          }
          break;
        }else if( c==':' && z[i+1]==':' ){
          i++;
#endif
        }else{
          break;
        }
      }
      if( n==0 ) *tokenType = TK_ILLEGAL;
      return i;
    }
    case CC_KYWD: {
      for(i=1; aiClass[z[i]]<=CC_KYWD; i++){}
      if( IdChar(z[i]) ){
        /* This token started out using characters that can appear in keywords,
        ** but z[i] is a character not allowed within keywords, so this must
        ** be an identifier instead */
        i++;
        break;
      }
      *tokenType = TK_ID;
      return keywordCode((char*)z, i, tokenType);
    }
    case CC_X: {
#ifndef SQLITE_OMIT_BLOB_LITERAL
      testcase( z[0]=='x' ); testcase( z[0]=='X' );
      if( z[1]=='\'' ){
        *tokenType = TK_BLOB;
        for(i=2; sqlite3Isxdigit(z[i]); i++){}
        if( z[i]!='\'' || i%2 ){
          *tokenType = TK_ILLEGAL;
          while( z[i] && z[i]!='\'' ){ i++; }
        }
        if( z[i] ) i++;
        return i;
      }
#endif
      /* If it is not a BLOB literal, then it must be an ID, since no
      ** SQL keywords start with the letter 'x'.  Fall through */
    }
    case CC_ID: {
      i = 1;
      break;
    }
    case CC_NUL: {
      *tokenType = TK_ILLEGAL;
      return 0;
    }
    default: {
      *tokenType = TK_ILLEGAL;
      return 1;
    }
  }
  while( IdChar(z[i]) ){ i++; }
  *tokenType = TK_ID;
  return i;
}